

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Data_Query_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Data_Query_PDU *this)

{
  pointer puVar1;
  ostream *poVar2;
  ulong uVar3;
  pointer puVar4;
  char cVar5;
  KString local_3c0;
  string local_3a0 [32];
  KString local_380;
  KString local_360;
  KStringStream ss;
  ostream local_330 [376];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  Header7::GetAsString_abi_cxx11_(&local_360,(Header7 *)this);
  poVar2 = std::operator<<(local_330,(string *)&local_360);
  poVar2 = std::operator<<(poVar2,"-Data Query PDU-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_380,&this->super_Simulation_Management_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_380);
  poVar2 = std::operator<<(poVar2,"Request ID:       ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"\nTime Interval:            \n");
  DATA_TYPE::TimeStamp::GetAsString_abi_cxx11_(&local_3c0,&this->m_TimeInterval);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,'\t');
  uVar3 = 0;
  while( true ) {
    uVar3 = uVar3 & 0xffff;
    if (local_3c0._M_string_length <= uVar3) break;
    cVar5 = local_3c0._M_dataplus._M_p[uVar3];
    if (local_3c0._M_string_length - 1 != uVar3 && cVar5 == '\n') {
      cVar5 = '\t';
      std::operator<<(local_1a8,'\n');
    }
    std::operator<<(local_1a8,cVar5);
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  poVar2 = std::operator<<(poVar2,local_3a0);
  poVar2 = std::operator<<(poVar2,"\nNumber Fixed Datum:         ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"\nNumber Variable Datum:      ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_360);
  std::operator<<(local_330,"Fixed Datum ID\'s\n");
  puVar1 = (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->m_vFixedDatum).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    poVar2 = std::operator<<(local_330,"\t");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n");
  }
  std::operator<<(local_330,"Variable Datum ID\'s\n");
  puVar1 = (this->m_vVariableDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->m_vVariableDatum).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    poVar2 = std::operator<<(local_330,"\t");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString Data_Query_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Data Query PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "Request ID:       "             << m_ui32RequestID
       << "\nTime Interval:            \n" << IndentString( m_TimeInterval.GetAsString() )
       << "\nNumber Fixed Datum:         " << m_ui32NumFixedDatum
       << "\nNumber Variable Datum:      " << m_ui32NumVariableDatum
       << "\n";

    ss << "Fixed Datum ID's\n";
    vector<KUINT32>::const_iterator citrFixed = m_vFixedDatum.begin();
    vector<KUINT32>::const_iterator citrFixedEnd = m_vFixedDatum.end();
    for( ; citrFixed != citrFixedEnd; ++citrFixed )
    {
        ss << "\t" << *citrFixed << "\n";
    }

    ss << "Variable Datum ID's\n";
    vector<KUINT32>::const_iterator citrVar = m_vVariableDatum.begin();
    vector<KUINT32>::const_iterator citrVarEnd = m_vVariableDatum.end();
    for( ; citrVar != citrVarEnd; ++citrVar )
    {
        ss << "\t" << *citrVar << "\n";
    }

    return ss.str();
}